

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O2

void __thiscall
cplus::utils::Stack<cplus::utils::Set<cplus::lang::String>::TreeNode_**>::forEach
          (Stack<cplus::utils::Set<cplus::lang::String>::TreeNode_**> *this,
          function<void_(cplus::utils::Set<cplus::lang::String>::TreeNode_**&)> *func)

{
  while (this = (Stack<cplus::utils::Set<cplus::lang::String>::TreeNode_**> *)this->state,
        this != (Stack<cplus::utils::Set<cplus::lang::String>::TreeNode_**> *)0x0) {
    std::function<void_(cplus::utils::Set<cplus::lang::String>::TreeNode_**&)>::operator()
              (func,(TreeNode ***)&this->maxSize);
  }
  return;
}

Assistant:

void forEach(std::function<void(T &)> func) const {
				StackPoint *state = this->state;
				while (state != nullptr) {
					func(state->get());
					state = state->prev();
				}
			}